

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlencode.c
# Opt level: O0

STRING_HANDLE URL_Decode(STRING_HANDLE input)

{
  LOGGER_LOG p_Var1;
  char *__s;
  size_t len;
  size_t __size;
  char *output;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  size_t inputLen;
  char *inputString;
  char *decodedString;
  size_t decodedStringSize;
  LOGGER_LOG l;
  STRING_HANDLE result;
  STRING_HANDLE input_local;
  
  if (input == (STRING_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/urlencode.c"
                ,"URL_Decode",0x142,1,"URL_Decode:: NULL input");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    __s = STRING_c_str(input);
    len = strlen(__s);
    __size = calculateDecodedStringSize(__s,len);
    if (__size == 0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/urlencode.c"
                  ,"URL_Decode",0x14d,1,"URL_Decode:: Invalid input string");
      }
      l = (LOGGER_LOG)0x0;
    }
    else {
      output = (char *)malloc(__size);
      if (output == (char *)0x0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/urlencode.c"
                    ,"URL_Decode",0x152,1,"URL_Decode:: MALLOC failure on decode.");
        }
        l = (LOGGER_LOG)0x0;
      }
      else {
        createDecodedString(__s,len,output);
        l = (LOGGER_LOG)STRING_new_with_memory(output);
        if ((STRING_HANDLE)l == (STRING_HANDLE)0x0) {
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/urlencode.c"
                      ,"URL_Decode",0x15b,1,"URL_Decode:: MALLOC failure on decode");
          }
          free(output);
        }
      }
    }
  }
  return (STRING_HANDLE)l;
}

Assistant:

STRING_HANDLE URL_Decode(STRING_HANDLE input)
{
    STRING_HANDLE result;
    if (input == NULL)
    {
        LogError("URL_Decode:: NULL input");
        result = NULL;
    }
    else
    {
        size_t decodedStringSize;
        char* decodedString;
        const char* inputString = STRING_c_str(input);
        size_t inputLen = strlen(inputString);
        if ((decodedStringSize = calculateDecodedStringSize(inputString, inputLen)) == 0)
        {
            LogError("URL_Decode:: Invalid input string");
            result = NULL;
        }
        else if ((decodedString = (char*)malloc(decodedStringSize)) == NULL)
        {
            LogError("URL_Decode:: MALLOC failure on decode.");
            result = NULL;
        }
        else
        {
            createDecodedString(inputString, inputLen, decodedString);
            result = STRING_new_with_memory(decodedString);
            if (result == NULL)
            {
                LogError("URL_Decode:: MALLOC failure on decode");
                free(decodedString);
            }
        }
    }
    return result;
}